

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ExceptionOr<kj::Promise<unsigned_long>_>::~ExceptionOr
          (ExceptionOr<kj::Promise<unsigned_long>_> *this)

{
  ExceptionOr<kj::Promise<unsigned_long>_> *this_local;
  
  Maybe<kj::Promise<unsigned_long>_>::~Maybe(&this->value);
  ExceptionOrValue::~ExceptionOrValue(&this->super_ExceptionOrValue);
  return;
}

Assistant:

ExceptionOr() = default;